

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc.c
# Opt level: O3

void gc_collectv(pExecutor exec,int *atoms,int *pairs,int *pointers)

{
  int iVar1;
  int iVar2;
  int iVar3;
  pContextStackFrame_conflict pCVar4;
  Expr expr;
  
  exec->gc_index = exec->gc_index + 1;
  for (pCVar4 = exec->stack->head; pCVar4 != (pContextStackFrame_conflict)0x0; pCVar4 = pCVar4->next
      ) {
    gc_scan_context(exec,pCVar4->context);
  }
  expr._4_4_ = 0;
  expr.type = (exec->code).type;
  expr.field_1.val_atom = (exec->code).field_1.val_atom;
  gc_mark_expression(exec,expr);
  iVar1 = gc_del_atoms(exec);
  iVar2 = gc_del_pairs(exec);
  iVar3 = gc_del_pointers(exec);
  if (atoms != (int *)0x0) {
    *atoms = iVar1;
  }
  if (pairs != (int *)0x0) {
    *pairs = iVar2;
  }
  if (pointers != (int *)0x0) {
    *pointers = iVar3;
  }
  return;
}

Assistant:

void gc_collectv(pExecutor exec, int *atoms, int *pairs, int *pointers)
{
    exec->gc_index++;
    gc_scan_context_stack(exec, exec->stack);
    gc_mark_expression(exec, exec->code);

    int atoms_count = gc_del_atoms(exec);
    int pairs_count = gc_del_pairs(exec);
    int pointers_count = gc_del_pointers(exec);
    if (atoms != NULL) *atoms = atoms_count;
    if (pairs != NULL) *pairs = pairs_count;
    if (pointers != NULL) *pointers = pointers_count;
}